

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tclpkcs11.c
# Opt level: O2

int tclpkcs11_pkinfo(ClientData cd,Tcl_Interp *interp,int objc,Tcl_Obj **objv)

{
  Tcl_Obj *pTVar1;
  tclpkcs11_handle *handle;
  _func_char_ptr_uint *p_Var2;
  long lVar3;
  long *data;
  _func_int_Tcl_Interp_ptr_Tcl_Obj_ptr_Tcl_Obj_ptr *p_Var4;
  int iVar5;
  long lVar6;
  uchar *outbuf;
  Tcl_Obj *pTVar7;
  char *pcVar8;
  Tcl_Obj *pTVar9;
  Tcl_Obj *pTVar10;
  CK_RV CVar11;
  long *plVar12;
  ProcErrorProc *pPVar13;
  Tcl_Obj *local_188;
  Tcl_Obj *local_180;
  Tcl_Obj *local_178;
  Tcl_Obj *local_170;
  Tcl_Obj *local_168;
  CK_OBJECT_HANDLE hObject;
  Tcl_Obj *local_150;
  Tcl_Obj *local_148;
  CK_ULONG foundObjs;
  long slotid_long;
  CK_OBJECT_CLASS objectclass_pk;
  CK_ATTRIBUTE templ_pk [8];
  CK_ATTRIBUTE local_68;
  undefined8 uStack_50;
  CK_OBJECT_CLASS *local_48;
  undefined8 local_40;
  
  local_68.ulValueLen = 0;
  uStack_50 = 0;
  local_68.type = 0x102;
  memcpy(templ_pk,&DAT_0010c490,0xc0);
  if (objc == 4) {
    pTVar7 = objv[1];
    pTVar1 = objv[2];
    pTVar9 = objv[3];
    lVar6 = (**(code **)((long)cd + 0x40))(cd,pTVar7);
    if ((lVar6 != 0) &&
       (handle = *(tclpkcs11_handle **)(lVar6 + 0x18), handle != (tclpkcs11_handle *)0x0)) {
      iVar5 = (*tclStubsPtr->tcl_GetLongFromObj)((Tcl_Interp_conflict *)interp,pTVar1,&slotid_long);
      if (iVar5 != 0) {
        return iVar5;
      }
      iVar5 = tclpkcs11_start_session(handle,slotid_long);
      if (iVar5 == 0) {
        p_Var2 = tclStubsPtr->tcl_Alloc;
        iVar5 = (*tclStubsPtr->tcl_GetCharLength)(pTVar9);
        outbuf = (uchar *)(*p_Var2)(iVar5 / 2);
        local_68.pValue = outbuf;
        iVar5 = (*tclStubsPtr->tcl_GetCharLength)(pTVar9);
        local_68.ulValueLen = tclpkcs11_string_to_bytearray(pTVar9,outbuf,(long)(iVar5 / 2));
        local_48 = &objectclass_pk;
        objectclass_pk = 2;
        local_40 = 8;
        CVar11 = (*handle->pkcs11->C_FindObjectsInit)(handle->session,&local_68,2);
        if (CVar11 == 0) {
          CVar11 = (*handle->pkcs11->C_FindObjects)(handle->session,&hObject,1,&foundObjs);
          if (CVar11 == 0) {
            (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
            if (foundObjs == 0) {
              pPVar13 = tclStubsPtr->tcl_SetObjResult;
              pcVar8 = "PKCS11_ERROR MAYBE_LOGIN";
              goto LAB_00106507;
            }
            if (foundObjs == 1) {
              for (lVar6 = 8; lVar6 != 200; lVar6 = lVar6 + 0x18) {
                pcVar8 = *(char **)((long)&templ_pk[0].type + lVar6);
                if (pcVar8 != (char *)0x0) {
                  (*tclStubsPtr->tcl_Free)(pcVar8);
                }
                *(undefined8 *)((long)&templ_pk[0].type + lVar6) = 0;
                *(undefined8 *)((long)&templ_pk[0].pValue + lVar6) = 0;
              }
              CVar11 = (*handle->pkcs11->C_GetAttributeValue)(handle->session,hObject,templ_pk,8);
              if (((0x12 < CVar11) || ((0x60001UL >> (CVar11 & 0x3f) & 1) == 0)) &&
                 (CVar11 != 0x150)) {
                return 1;
              }
              for (lVar6 = 0x10; lVar6 != 0xd0; lVar6 = lVar6 + 0x18) {
                lVar3 = *(long *)((long)&templ_pk[0].type + lVar6);
                if (lVar3 != -1) {
                  pcVar8 = (*tclStubsPtr->tcl_Alloc)((uint)lVar3);
                  *(char **)((long)templ_pk + lVar6 + -8) = pcVar8;
                }
              }
              lVar6 = 8;
              CVar11 = (*handle->pkcs11->C_GetAttributeValue)(handle->session,hObject,templ_pk,8);
              if (((CVar11 < 0x13) && ((0x60001UL >> (CVar11 & 0x3f) & 1) != 0)) ||
                 (CVar11 == 0x150)) {
                lVar6 = 0x10;
                local_170 = (Tcl_Obj *)0x0;
                local_178 = (Tcl_Obj *)0x0;
                local_180 = (Tcl_Obj *)0x0;
                plVar12 = (long *)0x0;
                do {
                  if (lVar6 == 0xd0) {
                    pTVar9 = (*tclStubsPtr->tcl_NewObj)();
                    p_Var4 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar10 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_handle",-1);
                    (*p_Var4)((Tcl_Interp_conflict *)interp,pTVar9,pTVar10);
                    (*tclStubsPtr->tcl_ListObjAppendElement)
                              ((Tcl_Interp_conflict *)interp,pTVar9,pTVar7);
                    p_Var4 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_slotid",-1);
                    (*p_Var4)((Tcl_Interp_conflict *)interp,pTVar9,pTVar7);
                    (*tclStubsPtr->tcl_ListObjAppendElement)
                              ((Tcl_Interp_conflict *)interp,pTVar9,pTVar1);
                    p_Var4 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_id",-1);
                    (*p_Var4)((Tcl_Interp_conflict *)interp,pTVar9,pTVar7);
                    (*tclStubsPtr->tcl_ListObjAppendElement)
                              ((Tcl_Interp_conflict *)interp,pTVar9,local_178);
                    p_Var4 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11_label",-1);
                    (*p_Var4)((Tcl_Interp_conflict *)interp,pTVar9,pTVar7);
                    (*tclStubsPtr->tcl_ListObjAppendElement)
                              ((Tcl_Interp_conflict *)interp,pTVar9,local_170);
                    p_Var4 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("pubkey",-1);
                    (*p_Var4)((Tcl_Interp_conflict *)interp,pTVar9,pTVar7);
                    (*tclStubsPtr->tcl_ListObjAppendElement)
                              ((Tcl_Interp_conflict *)interp,pTVar9,local_180);
                    p_Var4 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("pubkey_algo",-1);
                    (*p_Var4)((Tcl_Interp_conflict *)interp,pTVar9,pTVar7);
                    (*tclStubsPtr->tcl_ListObjAppendElement)
                              ((Tcl_Interp_conflict *)interp,pTVar9,local_188);
                    p_Var4 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("gostR3410params",-1);
                    (*p_Var4)((Tcl_Interp_conflict *)interp,pTVar9,pTVar7);
                    (*tclStubsPtr->tcl_ListObjAppendElement)
                              ((Tcl_Interp_conflict *)interp,pTVar9,local_150);
                    p_Var4 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("gostR3411params",-1);
                    (*p_Var4)((Tcl_Interp_conflict *)interp,pTVar9,pTVar7);
                    (*tclStubsPtr->tcl_ListObjAppendElement)
                              ((Tcl_Interp_conflict *)interp,pTVar9,local_168);
                    p_Var4 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("gost28147params",-1);
                    (*p_Var4)((Tcl_Interp_conflict *)interp,pTVar9,pTVar7);
                    (*tclStubsPtr->tcl_ListObjAppendElement)
                              ((Tcl_Interp_conflict *)interp,pTVar9,local_148);
                    p_Var4 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("type",-1);
                    (*p_Var4)((Tcl_Interp_conflict *)interp,pTVar9,pTVar7);
                    p_Var4 = tclStubsPtr->tcl_ListObjAppendElement;
                    pTVar7 = (*tclStubsPtr->tcl_NewStringObj)("pkcs11",-1);
                    (*p_Var4)((Tcl_Interp_conflict *)interp,pTVar9,pTVar7);
                    (*tclStubsPtr->tcl_SetObjResult)((Tcl_Interp_conflict *)interp,pTVar9);
                    return 0;
                  }
                  data = *(long **)((long)templ_pk + lVar6 + -8);
                  if (data != (long *)0x0) {
                    lVar3 = *(long *)((long)&slotid_long + lVar6);
                    if (lVar3 == 0x252) {
                      local_148 = tclpkcs11_bytearray_to_string
                                            ((uchar *)data,
                                             *(unsigned_long *)((long)&templ_pk[0].type + lVar6));
                    }
                    else if (lVar3 == 3) {
                      local_170 = (*tclStubsPtr->tcl_NewStringObj)
                                            ((char *)data,*(int *)((long)&templ_pk[0].type + lVar6))
                      ;
                    }
                    else if (lVar3 == 0x11) {
                      if (plVar12 == (long *)0x0) {
                        plVar12 = (long *)0x0;
                      }
                      else {
                        local_180 = tclpkcs11_bytearray_to_string
                                              ((uchar *)data,
                                               *(unsigned_long *)((long)&templ_pk[0].type + lVar6));
                      }
                    }
                    else if (lVar3 == 0x100) {
                      if (*data == 0xd4321003) {
                        local_188 = (*tclStubsPtr->tcl_NewStringObj)("1 2 643 7 1 1 1 2",-1);
                      }
                      else if (*data == 0x30) {
                        pcVar8 = (*tclStubsPtr->tcl_GetString)(local_168);
                        pcVar8 = strstr(pcVar8,"06082a850307");
                        if (pcVar8 == (char *)0x0) {
                          pcVar8 = "1 2 643 2 2 19";
                        }
                        else {
                          pcVar8 = "1 2 643 7 1 1 1 1";
                        }
                        local_188 = (*tclStubsPtr->tcl_NewStringObj)(pcVar8,-1);
                      }
                      else {
                        fwrite("tclpkcs11_perform_pki_pkinfo CKK_GOSTR ERROR\n",0x2d,1,_stderr);
                      }
                    }
                    else if (lVar3 == 0x102) {
                      local_178 = tclpkcs11_bytearray_to_string
                                            ((uchar *)data,
                                             *(unsigned_long *)((long)&templ_pk[0].type + lVar6));
                    }
                    else if (lVar3 == 0x250) {
                      local_150 = tclpkcs11_bytearray_to_string
                                            ((uchar *)data,
                                             *(unsigned_long *)((long)&templ_pk[0].type + lVar6));
                    }
                    else if (lVar3 == 0x251) {
                      local_168 = tclpkcs11_bytearray_to_string
                                            ((uchar *)data,
                                             *(unsigned_long *)((long)&templ_pk[0].type + lVar6));
                    }
                    else if ((lVar3 == 0) && (plVar12 = data, *data != 2)) goto LAB_00106945;
                    (*tclStubsPtr->tcl_Free)(*(char **)((long)templ_pk + lVar6 + -8));
                    *(undefined8 *)((long)templ_pk + lVar6 + -8) = 0;
                  }
LAB_00106945:
                  lVar6 = lVar6 + 0x18;
                } while( true );
              }
              for (; lVar6 != 200; lVar6 = lVar6 + 0x18) {
                pcVar8 = *(char **)((long)&templ_pk[0].type + lVar6);
                if (pcVar8 != (char *)0x0) {
                  (*tclStubsPtr->tcl_Free)(pcVar8);
                }
              }
              pPVar13 = tclStubsPtr->tcl_SetObjResult;
              pTVar7 = tclpkcs11_pkcs11_error(CVar11);
              (*pPVar13)((Tcl_Interp_conflict *)interp,pTVar7);
              goto LAB_0010661d;
            }
            pPVar13 = tclStubsPtr->tcl_SetObjResult;
            pTVar7 = (*tclStubsPtr->tcl_NewStringObj)
                               ("FindObjects() from pkinfo returned a weird number of objects.",-1);
          }
          else {
            pPVar13 = tclStubsPtr->tcl_SetObjResult;
            pTVar7 = tclpkcs11_pkcs11_error(CVar11);
          }
          (*pPVar13)((Tcl_Interp_conflict *)interp,pTVar7);
LAB_0010661d:
          (*handle->pkcs11->C_FindObjectsFinal)(handle->session);
          return 1;
        }
        pPVar13 = tclStubsPtr->tcl_SetObjResult;
      }
      else {
        CVar11 = (CK_RV)iVar5;
        pPVar13 = tclStubsPtr->tcl_SetObjResult;
      }
      pTVar7 = tclpkcs11_pkcs11_error(CVar11);
      goto LAB_00106510;
    }
    pPVar13 = tclStubsPtr->tcl_SetObjResult;
    pcVar8 = "invalid handle";
  }
  else {
    pPVar13 = tclStubsPtr->tcl_SetObjResult;
    pcVar8 = "wrong # args: should be \"pki::pkcs11::pkinfo handle slot pkcs11_id\"";
  }
LAB_00106507:
  pTVar7 = (*tclStubsPtr->tcl_NewStringObj)(pcVar8,-1);
LAB_00106510:
  (*pPVar13)((Tcl_Interp_conflict *)interp,pTVar7);
  return 1;
}

Assistant:

MODULE_SCOPE int tclpkcs11_pkinfo(ClientData cd, Tcl_Interp *interp, int objc, Tcl_Obj *CONST objv[]) {
  //fprintf(stderr, "PKIINFO START\n");
  return(tclpkcs11_perform_pki_pkinfo(cd, interp, objc, objv));
}